

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

void tinyformat::
     format<std::__cxx11::string,std::__cxx11::string,char[13],std::__cxx11::string,char[42]>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               char (*args_2) [13],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               char (*args_4) [42])

{
  long in_FS_OFFSET;
  FormatArg local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  code *local_60;
  code *local_58;
  char (*local_50) [13];
  code *local_48;
  code *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  code *local_30;
  code *local_28;
  char (*local_20) [42];
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.m_formatImpl = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_80.m_toIntImpl = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_60 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_58 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_48 = detail::FormatArg::formatImpl<char[13]>;
  local_40 = detail::FormatArg::toIntImpl<char[13]>;
  local_30 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_28 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_20 = args_4;
  local_18 = detail::FormatArg::formatImpl<char[42]>;
  local_10 = detail::FormatArg::toIntImpl<char[42]>;
  local_80.m_value = args;
  local_68 = args_1;
  local_50 = args_2;
  local_38 = args_3;
  detail::formatImpl(out,fmt,&local_80,5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}